

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<int,phmap::priv::NonStandardLayout>::
     transfer<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
               (Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> *alloc_local;
  
  map_slot_policy<int,_phmap::priv::NonStandardLayout>::emplace(new_slot);
  allocator_traits<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::
  construct<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            (alloc,&new_slot->value,&old_slot->value);
  destroy<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>(alloc,old_slot);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }